

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::DeepTiledOutputFile::DeepTiledOutputFile(DeepTiledOutputFile *this,OutputPartData *part)

{
  size_t __n;
  int iVar1;
  string *psVar2;
  Data *pDVar3;
  ArgExc *this_00;
  stringstream _iex_replace_s;
  
  GenericOutputFile::GenericOutputFile(&this->super_GenericOutputFile);
  (this->super_GenericOutputFile)._vptr_GenericOutputFile =
       (_func_int **)&PTR__DeepTiledOutputFile_003e1dc0;
  psVar2 = Header::type_abi_cxx11_((Header *)part);
  __n = psVar2->_M_string_length;
  if (__n == _DAT_003e5de0) {
    if (__n != 0) {
      iVar1 = bcmp((psVar2->_M_dataplus)._M_p,DEEPTILE_abi_cxx11_,__n);
      if (iVar1 != 0) goto LAB_0016faff;
    }
    pDVar3 = (Data *)operator_new(0x1d0);
    Data::Data(pDVar3,*(int *)(part + 0x48));
    this->_data = pDVar3;
    pDVar3->_streamData = *(OutputStreamMutex **)(part + 0x58);
    pDVar3->_deleteStream = false;
    initialize(this,(Header *)part);
    pDVar3 = this->_data;
    pDVar3->partNumber = *(int *)(part + 0x4c);
    pDVar3->tileOffsetsPosition = *(Int64 *)(part + 0x38);
    pDVar3->previewPosition = *(Int64 *)(part + 0x40);
    pDVar3->multipart = (bool)part[0x50];
    return;
  }
LAB_0016faff:
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,"Can\'t build a DeepTiledOutputFile from a type-mismatched part.")
  ;
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

DeepTiledOutputFile::DeepTiledOutputFile(const OutputPartData* part) 
{
   
    try
    {
        if (part->header.type() != DEEPTILE)
            throw IEX_NAMESPACE::ArgExc("Can't build a DeepTiledOutputFile from "
                              "a type-mismatched part.");

        _data = new Data (part->numThreads);
        _data->_streamData=part->mutex;
        _data->_deleteStream=false;
        initialize(part->header);
        _data->partNumber = part->partNumber;
        _data->tileOffsetsPosition = part->chunkOffsetTablePosition;
        _data->previewPosition = part->previewPosition;
	_data->multipart = part->multipart;
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        if (_data) delete _data;

        REPLACE_EXC (e, "Cannot initialize output part "
                     "\"" << part->partNumber << "\". " << e.what());
        throw;
    }
    catch (...)
    {
        if (_data) delete _data;

        throw;
    }
}